

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O2

deFileResult deFile_read(deFile *file,void *buf,deInt64 bufSize,deInt64 *numReadPtr)

{
  deFileResult dVar1;
  ssize_t numBytes;
  
  numBytes = read(file->fd,buf,bufSize);
  if (numReadPtr != (deInt64 *)0x0) {
    *numReadPtr = numBytes;
  }
  dVar1 = mapReadWriteResult(numBytes);
  return dVar1;
}

Assistant:

deFileResult deFile_read (deFile* file, void* buf, deInt64 bufSize, deInt64* numReadPtr)
{
	deInt64 numRead = read(file->fd, buf, (size_t)bufSize);

	if (numReadPtr)
		*numReadPtr = numRead;

	return mapReadWriteResult(numRead);
}